

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpsctl.c
# Opt level: O2

slReturn nmeaBaudRateSynchronizer(int fdPort,int maxTimeMs,int verbosity)

{
  errInfo error;
  errInfo error_00;
  _Bool _Var1;
  char cVar2;
  int iVar3;
  uint uVar4;
  longlong lVar5;
  slReturn pvVar6;
  long lVar7;
  longlong lVar8;
  slReturn value;
  void *pvVar9;
  uint uVar10;
  byte c;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar11;
  bool bVar12;
  void *pvStackY_b0;
  errorInfo_slReturn local_70;
  errorInfo_slReturn local_50;
  
  lVar5 = currentTimeMs();
  pvVar6 = flushRx(fdPort);
  _Var1 = isErrorReturn(pvVar6);
  uVar11 = extraout_RDX;
  if (_Var1) {
    createErrorInfo(&local_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                    ,"nmeaBaudRateSynchronizer",0x7b,pvVar6);
    error.fileName = local_50.fileName;
    error.cause = local_50.cause;
    error.functionName = local_50.functionName;
    error.lineNumber = local_50.lineNumber;
    error._28_4_ = local_50._28_4_;
    makeErrorMsgReturn(error,"could not flush receiver prior to synchronization");
    uVar11 = extraout_RDX_00;
  }
  lVar7 = (long)maxTimeMs;
  uVar10 = 0;
  bVar12 = false;
  do {
    c = (byte)uVar11;
LAB_001058bf:
    lVar8 = currentTimeMs();
    if (lVar5 + lVar7 <= lVar8) {
LAB_001059ad:
      pvStackY_b0 = (void *)0x0;
LAB_001059af:
      pvVar6 = makeOkInfoReturn(pvStackY_b0);
      return pvVar6;
    }
    lVar8 = currentTimeMs();
    value = readSerialChar(fdPort,(lVar5 + lVar7) - lVar8);
    _Var1 = isErrorReturn(value);
    if (_Var1) {
      createErrorInfo(&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                      ,"nmeaBaudRateSynchronizer",0x82,value);
      error_00.fileName = local_70.fileName;
      error_00.cause = local_70.cause;
      error_00.functionName = local_70.functionName;
      error_00.lineNumber = local_70.lineNumber;
      error_00._28_4_ = local_70._28_4_;
      pvVar6 = makeErrorMsgReturn(error_00,"problem reading a character while synchronizing");
      return pvVar6;
    }
    _Var1 = isWarningReturn(value);
    if (_Var1) goto LAB_001059ad;
    pvVar9 = getReturnInfo(value);
    cVar2 = (char)pvVar9;
    if (!bVar12) {
      bVar12 = cVar2 == '$';
      if (bVar12) {
        uVar10 = 0;
      }
      goto LAB_001058bf;
    }
    if ((cVar2 == '\r') || (((uint)pvVar9 & 0xff) == 10)) {
      bVar12 = false;
      if ((char)maxTimeMs == '*') {
        iVar3 = hex2int(c);
        maxTimeMs = 0x2a;
        bVar12 = false;
        if (-1 < iVar3) {
          uVar4 = hex2int((byte)pvVar6);
          bVar12 = false;
          if (-1 < (int)uVar4) {
            uVar10 = uVar10 ^ (int)(char)((byte)pvVar6 ^ c) ^ 0x2a;
            maxTimeMs = 0x2a;
            bVar12 = false;
            if ((uVar4 | iVar3 << 4) == uVar10) {
              pvStackY_b0 = (void *)0x1;
              goto LAB_001059af;
            }
          }
        }
      }
      goto LAB_001058bf;
    }
    uVar10 = uVar10 ^ (int)cVar2;
    bVar12 = true;
    maxTimeMs = (int)c;
    uVar11 = (ulong)pvVar6 & 0xffffffff;
    pvVar6 = (slReturn)((ulong)pvVar9 & 0xffffffff);
  } while( true );
}

Assistant:

static slReturn nmeaBaudRateSynchronizer(int fdPort, int maxTimeMs, int verbosity) {

    bool inLine = false;
    char last[3];
    int cksm = 0;
    long long start = currentTimeMs();

    // flush any junk we might have in the receiver buffer...
    slReturn frResp = flushRx(fdPort);
    if (isErrorReturn(frResp))
        makeErrorMsgReturn(ERR_CAUSE(frResp), "could not flush receiver prior to synchronization");

    // read characters until either we appear to be synchronized or we run out of time...
    while (currentTimeMs() < start + maxTimeMs) {

        slReturn rscResp = readSerialChar(fdPort, start + maxTimeMs - currentTimeMs());
        if (isErrorReturn(rscResp))
            return makeErrorMsgReturn(ERR_CAUSE(rscResp), "problem reading a character while synchronizing");
        if (isWarningReturn(rscResp))
            return makeOkInfoReturn(bool2info(false));

        char c = getReturnInfoChar(rscResp);
        if (inLine) {
            if ((c == '\r') || (c == '\n')) {
                if (last[0] == '*') {
                    int un = hex2int(last[1]);
                    if (un >= 0) {
                        int ln = hex2int(last[2]);
                        if (ln >= 0) {
                            int ck = (un << 4) | ln;

                            // correct checksum for the last three characters received...
                            cksm ^= last[0];
                            cksm ^= last[1];
                            cksm ^= last[2];

                            if (ck == cksm) {
                                return makeOkInfoReturn(bool2info(true));
                            }
                        }
                    }
                }
                inLine = false;
            }
            else {
                cksm ^= c;
                last[0] = last[1];
                last[1] = last[2];
                last[2] = c;
            }
        }
        else if (c == '$') {
            inLine = true;
            cksm = 0;
        }
    }
    return makeOkInfoReturn(bool2info(false));
}